

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O2

void __thiscall
ylt::metric::dynamic_metric_manager<test_id_t<1UL>_>::dynamic_metric_manager
          (dynamic_metric_manager<test_id_t<1UL>_> *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = std::thread::hardware_concurrency();
  uVar1 = 0x80;
  if (uVar2 < 0x80) {
    uVar1 = uVar2;
  }
  util::
  map_sharded_t<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::dynamic_metric>_>_>_>,_ylt::metric::dynamic_metric_manager<test_id_t<1UL>_>::my_hash<131UL>_>
  ::map_sharded_t(&this->metric_map_,(ulong)uVar1);
  (this->executor_).super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->executor_).super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->timer_).super___shared_ptr<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->timer_).super___shared_ptr<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (0 < ylt_label_max_age) {
    clean_label_expired(this);
  }
  return;
}

Assistant:

dynamic_metric_manager()
      : metric_map_(
            std::min<unsigned>(std::thread::hardware_concurrency(), 128u)) {
    if (ylt_label_max_age.count() > 0) {
      clean_label_expired();
    }
  }